

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O0

int __thiscall
helics::fileops::JsonMapBuilder::generatePlaceHolder
          (JsonMapBuilder *this,string *location,int32_t code)

{
  size_type sVar1;
  long in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *__args_1;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_18;
  
  __args_1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)(in_RDI + 8);
  sVar1 = std::
          map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          ::size((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                  *)0x71844e);
  local_18 = (int)sVar1 + 2;
  __x = &local_40;
  std::make_pair<std::__cxx11::string_const&,int&>(__x,(int *)__args_1);
  std::
  map<int,std::pair<std::__cxx11::string,int>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
  ::emplace<int&,std::pair<std::__cxx11::string,int>>
            ((map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),(int *)__x,__args_1);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::~pair
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)0x7184a9);
  return local_18;
}

Assistant:

int JsonMapBuilder::generatePlaceHolder(const std::string& location, int32_t code)
{
    int index = static_cast<int>(missing_components.size()) + 2;
    missing_components.emplace(index, std::make_pair(location, code));
    return index;
}